

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_auto_extension(_func_void *xInit)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  sqlite3_mutex *psVar5;
  void *pvVar6;
  ulong uVar7;
  
  iVar3 = sqlite3_initialize();
  if (iVar3 != 0) {
    return iVar3;
  }
  bVar1 = true;
  uVar7 = 0;
  if ((sqlite3Config.bCoreMutex == 0) ||
     (psVar5 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar5 == (sqlite3_mutex *)0x0)) {
    psVar5 = (sqlite3_mutex *)0x0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(psVar5);
    bVar1 = false;
  }
  pvVar6 = sqlite3Autoext_1;
  uVar2 = sqlite3Autoext_0;
  if ((ulong)sqlite3Autoext_0 == 0) {
LAB_001f3214:
    iVar3 = 0;
    if ((uint)uVar7 != sqlite3Autoext_0) goto LAB_001f3263;
  }
  else {
    uVar7 = 0;
    do {
      if (*(_func_void **)((long)sqlite3Autoext_1 + uVar7 * 8) == xInit) goto LAB_001f3214;
      uVar7 = uVar7 + 1;
    } while (sqlite3Autoext_0 != uVar7);
  }
  iVar4 = sqlite3_initialize();
  iVar3 = 7;
  if ((iVar4 == 0) &&
     (pvVar6 = sqlite3Realloc(pvVar6,(ulong)(uVar2 + 1) << 3), pvVar6 != (void *)0x0)) {
    sqlite3Autoext_1 = pvVar6;
    *(_func_void **)((long)pvVar6 + (ulong)sqlite3Autoext_0 * 8) = xInit;
    sqlite3Autoext_0 = sqlite3Autoext_0 + 1;
    iVar3 = 0;
  }
LAB_001f3263:
  if (!bVar1) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar5);
  }
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3_auto_extension(
  void (*xInit)(void)
){
  int rc = SQLITE_OK;
#ifndef SQLITE_OMIT_AUTOINIT
  rc = sqlite3_initialize();
  if( rc ){
    return rc;
  }else
#endif
  {
    u32 i;
#if SQLITE_THREADSAFE
    sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
    wsdAutoextInit;
    sqlite3_mutex_enter(mutex);
    for(i=0; i<wsdAutoext.nExt; i++){
      if( wsdAutoext.aExt[i]==xInit ) break;
    }
    if( i==wsdAutoext.nExt ){
      u64 nByte = (wsdAutoext.nExt+1)*sizeof(wsdAutoext.aExt[0]);
      void (**aNew)(void);
      aNew = sqlite3_realloc64(wsdAutoext.aExt, nByte);
      if( aNew==0 ){
        rc = SQLITE_NOMEM_BKPT;
      }else{
        wsdAutoext.aExt = aNew;
        wsdAutoext.aExt[wsdAutoext.nExt] = xInit;
        wsdAutoext.nExt++;
      }
    }
    sqlite3_mutex_leave(mutex);
    assert( (rc&0xff)==rc );
    return rc;
  }
}